

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

void __thiscall
tinyusdz::primvar::PrimVar::set_value<std::array<float,3ul>>(PrimVar *this,array<float,_3UL> *v)

{
  storage_union local_20;
  undefined **local_10;
  
  local_10 = &linb::any::vtable_for_type<std::array<float,3ul>>()::table;
  local_20.dynamic = (void *)*(undefined8 *)v->_M_elems;
  local_20._8_4_ = v->_M_elems[2];
  linb::any::swap((any *)&local_20,(any *)this);
  if (local_10 != (undefined **)0x0) {
    (*(code *)local_10[4])(&local_20);
  }
  return;
}

Assistant:

void set_value(const T &v) {
    _value = v;
  }